

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::WriteTo
          (Node *this,ObjectWriter *ow)

{
  NodeKind NVar1;
  ObjectWriter *in_R8;
  StringPiece *this_00;
  StringPiece name;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  
  NVar1 = this->kind_;
  if (NVar1 == MAP) {
    this_00 = &local_58;
  }
  else {
    if (NVar1 == LIST) {
      if ((this->suppress_empty_list_ == true) && (this->is_placeholder_ != false)) {
        return;
      }
      StringPiece::StringPiece<std::allocator<char>>(&local_48,&this->name_);
      (*ow->_vptr_ObjectWriter[4])(ow,local_48.ptr_,local_48.length_);
      WriteChildren(this,ow);
      (*ow->_vptr_ObjectWriter[5])(ow);
      return;
    }
    if (NVar1 == PRIMITIVE) {
      StringPiece::StringPiece<std::allocator<char>>(&local_68,&this->name_);
      name.length_ = (stringpiece_ssize_type)ow;
      name.ptr_ = (char *)local_68.length_;
      ObjectWriter::RenderDataPieceTo
                ((ObjectWriter *)&this->data_,(DataPiece *)local_68.ptr_,name,in_R8);
      return;
    }
    if (this->is_placeholder_ != false) {
      return;
    }
    this_00 = &local_38;
  }
  StringPiece::StringPiece<std::allocator<char>>(this_00,&this->name_);
  (*ow->_vptr_ObjectWriter[2])(ow,this_00->ptr_,this_00->length_);
  WriteChildren(this,ow);
  (*ow->_vptr_ObjectWriter[3])(ow);
  return;
}

Assistant:

void DefaultValueObjectWriter::Node::WriteTo(ObjectWriter* ow) {
  if (kind_ == PRIMITIVE) {
    ObjectWriter::RenderDataPieceTo(data_, name_, ow);
    return;
  }

  // Render maps. Empty maps are rendered as "{}".
  if (kind_ == MAP) {
    ow->StartObject(name_);
    WriteChildren(ow);
    ow->EndObject();
    return;
  }

  // Write out lists. If we didn't have any list in response, write out empty
  // list.
  if (kind_ == LIST) {
    // Suppress empty lists if requested.
    if (suppress_empty_list_ && is_placeholder_) return;

    ow->StartList(name_);
    WriteChildren(ow);
    ow->EndList();
    return;
  }

  // If is_placeholder_ = true, we didn't see this node in the response, so
  // skip output.
  if (is_placeholder_) return;

  ow->StartObject(name_);
  WriteChildren(ow);
  ow->EndObject();
}